

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::MergeReturnPass::RecordReturnValue(MergeReturnPass *this,BasicBlock *block)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  Op OVar1;
  Instruction *pIVar2;
  IRContext *pIVar3;
  Operand *local_1d8;
  undefined1 local_1c0 [24];
  Instruction *store_inst;
  Instruction *local_1a0;
  Instruction *local_198;
  undefined1 local_164 [12];
  pointer local_158;
  SmallVector<unsigned_int,_2UL> local_150;
  Operand local_128;
  Operand OStack_f8;
  iterator local_c8;
  _func_int **local_c0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_b8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_a0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  value_store;
  undefined1 local_90 [16];
  Instruction terminator;
  BasicBlock *block_local;
  MergeReturnPass *this_local;
  
  terminator.dbg_scope_ = (DebugScope)block;
  BasicBlock::tail((BasicBlock *)local_90);
  pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator*
                     ((iterator_template<spvtools::opt::Instruction> *)local_90);
  Instruction::Instruction((Instruction *)(local_90 + 8),pIVar2);
  OVar1 = Instruction::opcode((Instruction *)(local_90 + 8));
  if (OVar1 == OpReturnValue) {
    if (this->return_value_ == (Instruction *)0x0) {
      __assert_fail("return_value_ && \"Did not generate the variable to hold the return value.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                    ,0x240,"void spvtools::opt::MergeReturnPass::RecordReturnValue(BasicBlock *)");
    }
    pIVar2 = (Instruction *)operator_new(0x70);
    pIVar3 = Pass::context((Pass *)this);
    local_164._0_4_ = Instruction::result_id(this->return_value_);
    local_164._4_8_ = local_164;
    local_158 = (pointer)0x1;
    init_list_00._M_len = 1;
    init_list_00._M_array = (iterator)local_164._4_8_;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,init_list_00);
    Operand::Operand(&local_128,SPV_OPERAND_TYPE_ID,&local_150);
    store_inst._4_4_ = Instruction::GetSingleWordInOperand((Instruction *)(local_90 + 8),0);
    local_1a0 = (Instruction *)((long)&store_inst + 4);
    local_198 = (Instruction *)0x1;
    init_list._M_len = 1;
    init_list._M_array = (iterator)local_1a0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&stack0xfffffffffffffe70,init_list);
    Operand::Operand(&OStack_f8,SPV_OPERAND_TYPE_ID,(OperandData *)&stack0xfffffffffffffe70);
    local_c8 = &local_128;
    local_c0 = (_func_int **)0x2;
    std::allocator<spvtools::opt::Operand>::allocator
              ((allocator<spvtools::opt::Operand> *)((long)&store_inst + 3));
    __l._M_len = (size_type)local_c0;
    __l._M_array = local_c8;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_b8,__l,(allocator_type *)((long)&store_inst + 3));
    Instruction::Instruction(pIVar2,pIVar3,OpStore,0,0,&local_b8);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&local_a0,pIVar2);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_b8)
    ;
    std::allocator<spvtools::opt::Operand>::~allocator
              ((allocator<spvtools::opt::Operand> *)((long)&store_inst + 3));
    local_1d8 = (Operand *)&local_c8;
    do {
      local_1d8 = local_1d8 + -1;
      Operand::~Operand(local_1d8);
    } while (local_1d8 != &local_128);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&stack0xfffffffffffffe70);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_150);
    BasicBlock::tail((BasicBlock *)local_1c0);
    InstructionList::iterator::InsertBefore
              ((iterator *)(local_1c0 + 8),
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)local_1c0);
    local_1c0._16_8_ =
         utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*
                   ((iterator_template<spvtools::opt::Instruction> *)(local_1c0 + 8));
    pIVar3 = Pass::context((Pass *)this);
    IRContext::set_instr_block
              (pIVar3,(Instruction *)local_1c0._16_8_,(BasicBlock *)terminator.dbg_scope_);
    pIVar3 = Pass::context((Pass *)this);
    IRContext::AnalyzeDefUse(pIVar3,(Instruction *)local_1c0._16_8_);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_a0);
    value_store._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = 0;
  }
  else {
    value_store._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = 1;
  }
  Instruction::~Instruction((Instruction *)(local_90 + 8));
  return;
}

Assistant:

void MergeReturnPass::RecordReturnValue(BasicBlock* block) {
  auto terminator = *block->tail();
  if (terminator.opcode() != spv::Op::OpReturnValue) {
    return;
  }

  assert(return_value_ &&
         "Did not generate the variable to hold the return value.");

  std::unique_ptr<Instruction> value_store(new Instruction(
      context(), spv::Op::OpStore, 0, 0,
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_ID, {return_value_->result_id()}},
          {SPV_OPERAND_TYPE_ID, {terminator.GetSingleWordInOperand(0u)}}}));

  Instruction* store_inst =
      &*block->tail().InsertBefore(std::move(value_store));
  context()->set_instr_block(store_inst, block);
  context()->AnalyzeDefUse(store_inst);
}